

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetLanguages
          (cmGeneratorTarget *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,string *config)

{
  pointer ppcVar1;
  size_type sVar2;
  pointer ppcVar3;
  bool bVar4;
  string *__v;
  pointer ppcVar5;
  long lVar6;
  long lVar7;
  pointer ppcVar8;
  pointer ppcVar9;
  _Alloc_hider _Var10;
  pointer ppcVar11;
  cmGeneratorTarget *tgt;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> objectLibraries;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  string objLib;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  cmGeneratorTarget *local_b0;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_a8;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_88;
  string local_68;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_48;
  
  bVar4 = CanCompileSources(this);
  if (bVar4) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetSourceFiles(this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_48,config)
    ;
    ppcVar3 = local_48._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar8 = local_48._M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar3;
        ppcVar8 = ppcVar8 + 1) {
      __v = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(*ppcVar8);
      if (__v->_M_string_length != 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)languages,__v);
      }
    }
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      GetObjectLibrariesCMP0026
                (this,(vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_68
                );
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::reserve
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_a8,
                 (long)(local_68._M_string_length - (long)local_68._M_dataplus._M_p) >> 3);
      sVar2 = local_68._M_string_length;
      for (_Var10._M_p = local_68._M_dataplus._M_p; _Var10._M_p != (pointer)sVar2;
          _Var10._M_p = _Var10._M_p + 8) {
        local_b0 = *(cmGeneratorTarget **)_Var10._M_p;
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
                  ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_a8,
                   &local_b0);
      }
      std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                ((_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                 &local_68);
      ppcVar11 = local_a8._M_impl.super__Vector_impl_data._M_start;
      ppcVar5 = local_a8._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      GetExternalObjects(this,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *
                              )&local_88,config);
      ppcVar1 = local_88._M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar9 = local_88._M_impl.super__Vector_impl_data._M_start;
          ppcVar11 = local_a8._M_impl.super__Vector_impl_data._M_start,
          ppcVar5 = local_a8._M_impl.super__Vector_impl_data._M_finish, ppcVar9 != ppcVar1;
          ppcVar9 = ppcVar9 + 1) {
        cmSourceFile::GetObjectLibrary_abi_cxx11_(&local_68,*ppcVar9);
        local_b0 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,&local_68);
        if (local_b0 != (cmGeneratorTarget *)0x0) {
          lVar6 = (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_a8._M_impl.super__Vector_impl_data._M_start;
          ppcVar5 = local_a8._M_impl.super__Vector_impl_data._M_start;
          for (lVar7 = lVar6 >> 5; 0 < lVar7; lVar7 = lVar7 + -1) {
            if (*ppcVar5 == local_b0) goto LAB_00352e6b;
            if (ppcVar5[1] == local_b0) {
              ppcVar5 = ppcVar5 + 1;
              goto LAB_00352e6b;
            }
            if (ppcVar5[2] == local_b0) {
              ppcVar5 = ppcVar5 + 2;
              goto LAB_00352e6b;
            }
            if (ppcVar5[3] == local_b0) {
              ppcVar5 = ppcVar5 + 3;
              goto LAB_00352e6b;
            }
            ppcVar5 = ppcVar5 + 4;
            lVar6 = lVar6 + -0x20;
          }
          lVar6 = lVar6 >> 3;
          if (lVar6 == 1) {
LAB_00352e52:
            if (*ppcVar5 != local_b0) {
              ppcVar5 = local_a8._M_impl.super__Vector_impl_data._M_finish;
            }
LAB_00352e6b:
            if (local_a8._M_impl.super__Vector_impl_data._M_finish != ppcVar5) goto LAB_00352e7f;
          }
          else {
            if (lVar6 == 2) {
LAB_00352e49:
              if (*ppcVar5 != local_b0) {
                ppcVar5 = ppcVar5 + 1;
                goto LAB_00352e52;
              }
              goto LAB_00352e6b;
            }
            if (lVar6 == 3) {
              if (*ppcVar5 != local_b0) {
                ppcVar5 = ppcVar5 + 1;
                goto LAB_00352e49;
              }
              goto LAB_00352e6b;
            }
          }
          std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
                    ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_a8,
                     &local_b0);
        }
LAB_00352e7f:
        std::__cxx11::string::~string((string *)&local_68);
      }
    }
    for (; ppcVar11 != ppcVar5; ppcVar11 = ppcVar11 + 1) {
      GetLanguages(*ppcVar11,languages,config);
    }
    std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
              (&local_88);
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_a8);
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetLanguages(std::set<std::string>& languages,
                                     const std::string& config) const
{
  // Targets that do not compile anything have no languages.
  if (!this->CanCompileSources()) {
    return;
  }

  std::vector<cmSourceFile*> sourceFiles;
  this->GetSourceFiles(sourceFiles, config);
  for (cmSourceFile* src : sourceFiles) {
    const std::string& lang = src->GetOrDetermineLanguage();
    if (!lang.empty()) {
      languages.insert(lang);
    }
  }

  std::vector<cmGeneratorTarget*> objectLibraries;
  std::vector<cmSourceFile const*> externalObjects;
  if (!this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    std::vector<cmGeneratorTarget*> objectTargets;
    this->GetObjectLibrariesCMP0026(objectTargets);
    objectLibraries.reserve(objectTargets.size());
    for (cmGeneratorTarget* gt : objectTargets) {
      objectLibraries.push_back(gt);
    }
  } else {
    this->GetExternalObjects(externalObjects, config);
    for (cmSourceFile const* extObj : externalObjects) {
      std::string objLib = extObj->GetObjectLibrary();
      if (cmGeneratorTarget* tgt =
            this->LocalGenerator->FindGeneratorTargetToUse(objLib)) {
        auto const objLibIt =
          std::find_if(objectLibraries.cbegin(), objectLibraries.cend(),
                       [tgt](cmGeneratorTarget* t) { return t == tgt; });
        if (objectLibraries.cend() == objLibIt) {
          objectLibraries.push_back(tgt);
        }
      }
    }
  }
  for (cmGeneratorTarget* objLib : objectLibraries) {
    objLib->GetLanguages(languages, config);
  }
}